

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatclient.cpp
# Opt level: O0

int __thiscall ChatClient::qt_metacall(ChatClient *this,Call _c,int _id,void **_a)

{
  void **_a_local;
  int _id_local;
  Call _c_local;
  ChatClient *this_local;
  
  _a_local._0_4_ = QObject::qt_metacall((Call)this,_c,(void **)(ulong)(uint)_id);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if (_c == InvokeMetaMethod) {
      if ((int)_a_local < 0xd) {
        qt_static_metacall(&this->super_QObject,InvokeMetaMethod,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -0xd;
    }
    else if (_c == RegisterMethodArgumentMetaType) {
      if ((int)_a_local < 0xd) {
        qt_static_metacall(&this->super_QObject,RegisterMethodArgumentMetaType,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -0xd;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int ChatClient::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 13)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 13;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 13)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 13;
    }
    return _id;
}